

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NonlinearSolvers.cpp
# Opt level: O1

double DiscreteNewtonsMethod(double start,Func1D *f,double h,double eps,int *iterations)

{
  double dVar1;
  double *pdVar2;
  anon_class_40_2_94731ee7 df;
  _Any_data local_78;
  code *local_68;
  code *pcStack_60;
  double local_50;
  double local_48;
  _Any_data local_40;
  code *local_30;
  
  local_50 = start;
  local_48 = h;
  std::function<double_(double)>::function((function<double_(double)> *)&local_40,f);
  local_68 = (code *)0x0;
  pcStack_60 = (code *)0x0;
  local_78._M_unused._M_object = (void *)0x0;
  local_78._8_8_ = 0;
  pdVar2 = (double *)operator_new(0x28);
  *pdVar2 = local_48;
  std::function<double_(double)>::function
            ((function<double_(double)> *)(pdVar2 + 1),(function<double_(double)> *)&local_40);
  pcStack_60 = std::
               _Function_handler<double_(double),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/sMeDDveD[P]CalculationMethodsLab2/Sources/NonlinearSolvers.cpp:22:15)>
               ::_M_invoke;
  local_68 = std::
             _Function_handler<double_(double),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/sMeDDveD[P]CalculationMethodsLab2/Sources/NonlinearSolvers.cpp:22:15)>
             ::_M_manager;
  local_78._M_unused._M_object = pdVar2;
  dVar1 = NewtonsMethod(local_50,f,(Func1D *)&local_78,eps,iterations);
  if (local_68 != (code *)0x0) {
    (*local_68)(&local_78,&local_78,__destroy_functor);
  }
  if (local_30 != (code *)0x0) {
    (*local_30)(&local_40,&local_40,__destroy_functor);
  }
  return dVar1;
}

Assistant:

double DiscreteNewtonsMethod(double start, const Func1D &f, double h, double eps, int &iterations)
{
    auto df = [h, f](double x)
    { return (f(x + h) - f(x)) / h; };

    return NewtonsMethod(start, f, df, eps, iterations);
}